

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O3

Compressed_lower_distance_matrix *
read_distance_matrix(Compressed_lower_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  char cVar1;
  istream *piVar2;
  int iVar3;
  int iVar4;
  value_t value;
  vector<float,_std::allocator<float>_> distances;
  string line;
  istringstream s;
  float local_1fc;
  vector<float,_std::allocator<float>_> local_1f8;
  Compressed_lower_distance_matrix *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  iVar3 = 0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1d8 = __return_storage_ptr__;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)input_stream + -0x18) +
                            (char)input_stream);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input_stream,(string *)&local_1d0,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    iVar4 = iVar3;
    while ((iVar4 != 0 &&
           (piVar2 = std::istream::_M_extract<float>((float *)local_1b0),
           ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0))) {
      if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_1f8,
                   (iterator)
                   local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1fc);
      }
      else {
        *local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = local_1fc;
        local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::istream::ignore();
      iVar4 = iVar4 + -1;
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    iVar3 = iVar3 + 1;
  }
  Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
  Compressed_distance_matrix(local_1d8,&local_1f8);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  if (local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_1d8;
}

Assistant:

Compressed_lower_distance_matrix read_distance_matrix(std::istream& input_stream) {
  std::vector<value_t> distances;

  std::string line;
  value_t value;
  for (int i = 0; std::getline(input_stream, line); ++i) {
    std::istringstream s(line);
    for (int j = 0; j < i && s >> value; ++j) {
      distances.push_back(value);
      s.ignore();
    }
  }

  return Compressed_lower_distance_matrix(std::move(distances));
}